

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O0

Unit * __thiscall Kernel::Inference::next(Inference *this,Iterator *it)

{
  List<Kernel::Unit_*> *this_00;
  List<Kernel::Unit_*> *pLVar1;
  int *in_RSI;
  byte *in_RDI;
  UnitList *lst;
  Unit *local_8;
  
  if ((*in_RDI & 3) == 0) {
    if (*in_RSI == 0) {
      *in_RSI = *in_RSI + 1;
      local_8 = *(Unit **)(in_RDI + 0x18);
    }
    else {
      *in_RSI = *in_RSI + 1;
      local_8 = *(Unit **)(in_RDI + 0x20);
    }
  }
  else {
    this_00 = *(List<Kernel::Unit_*> **)in_RSI;
    pLVar1 = Lib::List<Kernel::Unit_*>::tail(this_00);
    *(List<Kernel::Unit_*> **)in_RSI = pLVar1;
    local_8 = Lib::List<Kernel::Unit_*>::head(this_00);
  }
  return local_8;
}

Assistant:

Unit* Inference::next(Iterator& it) const
{
  switch(_kind) {
    case Kind::INFERENCE_012:
      switch(it.integer) {
      case 0:
        it.integer++;
        return static_cast<Unit*>(_ptr1);
      case 1:
        it.integer++;
        return static_cast<Unit*>(_ptr2);
      default:
        ASSERTION_VIOLATION;
        return nullptr;
      }
      break;
    case Kind::INFERENCE_MANY:
    case Kind::INFERENCE_FROM_SAT_REFUTATION: {
      UnitList* lst = static_cast<UnitList*>(it.pointer);
      it.pointer = lst->tail();
      return lst->head();
    }
    default:
      ASSERTION_VIOLATION;
      return nullptr;
  }
}